

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipc.c
# Opt level: O3

void nn_cipc_destroy(void *self)

{
  nn_sipc_term((nn_sipc *)((long)self + 0x3c0));
  nn_backoff_term((nn_backoff *)((long)self + 0x2c8));
  nn_usock_term((nn_usock *)((long)self + 0x68));
  nn_fsm_term((nn_fsm *)self);
  nn_free(self);
  return;
}

Assistant:

static void nn_cipc_destroy (void *self)
{
    struct nn_cipc *cipc = self;

    nn_sipc_term (&cipc->sipc);
    nn_backoff_term (&cipc->retry);
    nn_usock_term (&cipc->usock);
    nn_fsm_term (&cipc->fsm);

    nn_free (cipc);
}